

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

int xmlIsCatastrophicError(int level,int code)

{
  int iVar1;
  
  iVar1 = 0;
  if (level == 3) {
    iVar1 = 1;
    if ((1 < code - 1U) && (1 < code - 0x73U)) {
      return (int)(code - 0x5dcU < 100);
    }
  }
  return iVar1;
}

Assistant:

int
xmlIsCatastrophicError(int level, int code) {
    int fatal = 0;

    if (level != XML_ERR_FATAL)
        return(0);

    switch (code) {
        case XML_ERR_NO_MEMORY:
        /* case XML_ERR_RESOURCE_LIMIT: */
        case XML_ERR_SYSTEM:
        case XML_ERR_ARGUMENT:
        case XML_ERR_INTERNAL_ERROR:
            fatal = 1;
            break;
        default:
            if ((code >= 1500) && (code <= 1599))
                fatal = 1;
            break;
    }

    return(fatal);
}